

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMatrixSolver.h
# Opt level: O0

void __thiscall
TPZMatrixSolver<float>::SetReferenceMatrix
          (TPZMatrixSolver<float> *this,TPZAutoPointer<TPZBaseMatrix> *matrix)

{
  TPZAutoPointer<TPZBaseMatrix> *in_RDI;
  TPZAutoPointer<TPZBaseMatrix> *in_stack_00000008;
  TPZAutoPointer<TPZBaseMatrix> *in_stack_ffffffffffffffb8;
  
  TPZAutoPointer<TPZBaseMatrix>::TPZAutoPointer(in_RDI,in_stack_ffffffffffffffb8);
  TPZAutoPointerDynamicCast<TPZMatrix<float>,TPZBaseMatrix>(in_stack_00000008);
  TPZAutoPointer<TPZMatrix<float>_>::operator=
            ((TPZAutoPointer<TPZMatrix<float>_> *)in_RDI,
             (TPZAutoPointer<TPZMatrix<float>_> *)in_stack_ffffffffffffffb8);
  TPZAutoPointer<TPZMatrix<float>_>::~TPZAutoPointer((TPZAutoPointer<TPZMatrix<float>_> *)in_RDI);
  TPZAutoPointer<TPZBaseMatrix>::~TPZAutoPointer(in_RDI);
  return;
}

Assistant:

virtual void SetReferenceMatrix(TPZAutoPointer<TPZBaseMatrix> matrix)
	{
		fReferenceMatrix = TPZAutoPointerDynamicCast<TPZMatrix<TVar>>(matrix);
	}